

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O2

void MOJOSHADER_glSetPixelShaderUniformB(uint idx,int *data,uint bcount)

{
  uint32 *puVar1;
  MOJOSHADER_glContext *pMVar2;
  ulong uVar3;
  ulong uVar4;
  
  pMVar2 = ctx;
  if (idx < 0x1ff) {
    uVar4 = (ulong)(0x1ff - idx);
    if (bcount <= 0x1ff - idx) {
      uVar4 = (ulong)bcount;
    }
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      pMVar2->ps_reg_file_b[uVar3 + idx] = data[uVar3] != 0;
    }
    puVar1 = &pMVar2->generation;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void MOJOSHADER_glSetPixelShaderUniformB(unsigned int idx, const int *data,
                                         unsigned int bcount)
{
    const uint maxregs = STATICARRAYLEN(ctx->ps_reg_file_b) / 4;
    if (idx < maxregs)
    {
        uint8 *wptr = ctx->ps_reg_file_b + idx;
        uint8 *endptr = wptr + minuint(maxregs - idx, bcount);
        while (wptr != endptr)
            *(wptr++) = *(data++) ? 1 : 0;
        ctx->generation++;
    } // if
}